

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

gvector gvector_dup(gvector_const v)

{
  gvector *w;
  gvector_const v_local;
  
  if (v == (gvector_const)0x0) {
    v_local = (gvector_const)0x0;
  }
  else {
    v_local = gvector_alloc(*(size_t *)((long)v + -0x18),*(size_t *)((long)v + -8),
                            *(size_t *)((long)v + -0x10));
    if (v_local != (gvector)0x0) {
      memcpy(v_local,v,*(long *)((long)v + -8) * *(long *)((long)v + -0x10));
    }
  }
  return v_local;
}

Assistant:

gvector gvector_dup(gvector_const v)
{
  if (v)
  {
    gvector *w = gvector_alloc(gvector_cap(v), gvector_len(v), gvector_size(v));
    if (w)
    {
      memcpy(w, v, gvector_len(v) * gvector_size(v));
    }
    return w;
  }
  return NULL;
}